

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_kiss.c
# Opt level: O0

void csp_kiss_rx(csp_iface_t *iface,uint8_t *buf,size_t len,void *pxTaskWoken)

{
  uint uVar1;
  int iVar2;
  csp_packet_t *in_RCX;
  long lVar3;
  char *pcVar4;
  long in_RDX;
  char *in_RSI;
  long in_RDI;
  uint8_t inputbyte;
  csp_kiss_interface_data_t *ifdata;
  csp_packet_t *in_stack_ffffffffffffffb8;
  csp_packet_t *local_40;
  undefined7 in_stack_ffffffffffffffd0;
  char cVar5;
  csp_iface_t *iface_00;
  long local_18;
  char *local_10;
  
  iface_00 = *(csp_iface_t **)(in_RDI + 0x10);
  local_18 = in_RDX;
  local_10 = in_RSI;
  while (lVar3 = local_18 + -1, local_18 != 0) {
    pcVar4 = local_10 + 1;
    cVar5 = *local_10;
    if ((iface_00->driver_data != (void *)0x0) &&
       ((long)iface_00->driver_data + 0x140U <=
        *(long *)((long)iface_00->driver_data + 0x10) + (ulong)*(uint *)((long)&iface_00->name + 4))
       ) {
      *(int *)(in_RDI + 0x38) = *(int *)(in_RDI + 0x38) + 1;
      *(undefined4 *)&iface_00->name = 0;
      *(undefined4 *)((long)&iface_00->name + 4) = 0;
    }
    local_18 = lVar3;
    local_10 = pcVar4;
    switch(*(undefined4 *)&iface_00->name) {
    case 0:
      if (cVar5 == -0x40) {
        if (iface_00->driver_data == (void *)0x0) {
          if (in_RCX == (csp_packet_t *)0x0) {
            local_40 = csp_buffer_get_always();
          }
          else {
            local_40 = csp_buffer_get_always_isr();
          }
          iface_00->driver_data = local_40;
        }
        if (iface_00->driver_data == (void *)0x0) {
          *(undefined4 *)&iface_00->name = 3;
          *(int *)(in_RDI + 0x3c) = *(int *)(in_RDI + 0x3c) + 1;
        }
        else {
          csp_id_setup_rx(in_stack_ffffffffffffffb8);
          *(undefined4 *)((long)&iface_00->name + 4) = 0;
          *(undefined4 *)&iface_00->name = 1;
          *(undefined1 *)&iface_00->interface_data = 1;
        }
      }
      break;
    case 1:
      if (cVar5 == -0x25) {
        *(undefined4 *)&iface_00->name = 2;
      }
      else if (cVar5 == -0x40) {
        if (*(int *)((long)&iface_00->name + 4) != 0) {
          *(short *)((long)iface_00->driver_data + 0x18) =
               (short)*(undefined4 *)((long)&iface_00->name + 4);
          iVar2 = csp_id_strip(in_stack_ffffffffffffffb8);
          if (iVar2 < 0) {
            *(int *)(in_RDI + 0x44) = *(int *)(in_RDI + 0x44) + 1;
            *(undefined4 *)&iface_00->name = 0;
          }
          else {
            iVar2 = csp_crc32_verify(in_stack_ffffffffffffffb8);
            if (iVar2 == 0) {
              csp_qfifo_write(in_RCX,iface_00,(void *)CONCAT17(cVar5,in_stack_ffffffffffffffd0));
              iface_00->driver_data = (void *)0x0;
              *(undefined4 *)&iface_00->name = 0;
            }
            else {
              *(int *)(in_RDI + 0x44) = *(int *)(in_RDI + 0x44) + 1;
              *(undefined4 *)&iface_00->name = 0;
            }
          }
        }
      }
      else if (((ulong)iface_00->interface_data & 1) == 0) {
        lVar3 = *(long *)((long)iface_00->driver_data + 0x10);
        uVar1 = *(uint *)((long)&iface_00->name + 4);
        *(uint *)((long)&iface_00->name + 4) = uVar1 + 1;
        *(char *)(lVar3 + (ulong)uVar1) = cVar5;
      }
      else {
        *(undefined1 *)&iface_00->interface_data = 0;
      }
      break;
    case 2:
      if (cVar5 == -0x23) {
        lVar3 = *(long *)((long)iface_00->driver_data + 0x10);
        uVar1 = *(uint *)((long)&iface_00->name + 4);
        *(uint *)((long)&iface_00->name + 4) = uVar1 + 1;
        *(undefined1 *)(lVar3 + (ulong)uVar1) = 0xdb;
      }
      if (cVar5 == -0x24) {
        lVar3 = *(long *)((long)iface_00->driver_data + 0x10);
        uVar1 = *(uint *)((long)&iface_00->name + 4);
        *(uint *)((long)&iface_00->name + 4) = uVar1 + 1;
        *(undefined1 *)(lVar3 + (ulong)uVar1) = 0xc0;
      }
      *(undefined4 *)&iface_00->name = 1;
      break;
    case 3:
      if (cVar5 == -0x40) {
        *(undefined4 *)&iface_00->name = 0;
      }
    }
  }
  return;
}

Assistant:

void csp_kiss_rx(csp_iface_t * iface, const uint8_t * buf, size_t len, void * pxTaskWoken) {

	csp_kiss_interface_data_t * ifdata = iface->interface_data;

	while (len--) {

		/* Input */
		uint8_t inputbyte = *buf++;

		/* If packet was too long, truncate and restart */
		if (ifdata->rx_packet != NULL && &ifdata->rx_packet->frame_begin[ifdata->rx_length] >= &ifdata->rx_packet->data[sizeof(ifdata->rx_packet->data)]) {
			iface->rx_error++;
			ifdata->rx_mode = KISS_MODE_NOT_STARTED;
			ifdata->rx_length = 0;
		}

		switch (ifdata->rx_mode) {

			case KISS_MODE_NOT_STARTED:

				/* Skip any characters until End char detected */
				if (inputbyte != FEND) {
					break;
				}

				/* Always allocate new buffer */
				if (ifdata->rx_packet == NULL) {
					ifdata->rx_packet = pxTaskWoken ? csp_buffer_get_always_isr() : csp_buffer_get_always();
				}

				/* If no more memory, skip frame */
				if (ifdata->rx_packet == NULL) {
					ifdata->rx_mode = KISS_MODE_SKIP_FRAME;
					iface->drop++;
					break;
				}

				/* Start transfer */
				csp_id_setup_rx(ifdata->rx_packet);
				ifdata->rx_length = 0;
				ifdata->rx_mode = KISS_MODE_STARTED;
				ifdata->rx_first = true;
				break;

			case KISS_MODE_STARTED:

				/* Escape char */
				if (inputbyte == FESC) {
					ifdata->rx_mode = KISS_MODE_ESCAPED;
					break;
				}

				/* End Char */
				if (inputbyte == FEND) {

					/* Accept message */
					if (ifdata->rx_length > 0) {

						ifdata->rx_packet->frame_length = ifdata->rx_length;
						if (csp_id_strip(ifdata->rx_packet) < 0) {
							iface->frame++;
							ifdata->rx_mode = KISS_MODE_NOT_STARTED;
							break;
						}

						/* Validate CRC */
						if (csp_crc32_verify(ifdata->rx_packet) != CSP_ERR_NONE) {
							iface->frame++;
							ifdata->rx_mode = KISS_MODE_NOT_STARTED;
							break;
						}

						/* Send back into CSP, notice calling from task so last argument must be NULL! */
						csp_qfifo_write(ifdata->rx_packet, iface, pxTaskWoken);
						ifdata->rx_packet = NULL;
						ifdata->rx_mode = KISS_MODE_NOT_STARTED;
						break;
					}

					/* Break after the end char */
					break;
				}

				/* Skip the first char after FEND which is TNC_DATA (0x00) */
				if (ifdata->rx_first) {
					ifdata->rx_first = false;
					break;
				}

				/* Valid data char */
				ifdata->rx_packet->frame_begin[ifdata->rx_length++] = inputbyte;

				break;

			case KISS_MODE_ESCAPED:

				/* Escaped escape char */
				if (inputbyte == TFESC)
					ifdata->rx_packet->frame_begin[ifdata->rx_length++] = FESC;

				/* Escaped fend char */
				if (inputbyte == TFEND)
					ifdata->rx_packet->frame_begin[ifdata->rx_length++] = FEND;

				/* Go back to started mode */
				ifdata->rx_mode = KISS_MODE_STARTED;
				break;

			case KISS_MODE_SKIP_FRAME:

				/* Just wait for end char */
				if (inputbyte == FEND)
					ifdata->rx_mode = KISS_MODE_NOT_STARTED;

				break;
		}
	}
}